

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ANN.cpp
# Opt level: O2

void __thiscall ANN::addLayer(ANN *this,int size,string *type)

{
  int iVar1;
  long lVar2;
  Filter *pFVar3;
  string *this_00;
  Filter *local_70;
  string local_68;
  string local_48;
  
  this->outputSize = size;
  lVar2 = std::__cxx11::string::rfind((char *)type,0x1277b8);
  if (lVar2 != 0) {
    lVar2 = std::__cxx11::string::rfind((char *)type,0x1277c0);
    if (lVar2 != 0) {
      lVar2 = std::__cxx11::string::rfind((char *)type,0x1277c9);
      if (lVar2 != 0) {
        pFVar3 = (Filter *)operator_new(0x90);
        iVar1 = this->inputSize;
        std::__cxx11::string::string((string *)&local_68,(string *)type);
        Dense::Dense((Dense *)pFVar3,iVar1,size,&this->learning_rate,&local_68);
        local_70 = pFVar3;
        std::vector<Layer*,std::allocator<Layer*>>::emplace_back<Layer*>
                  ((vector<Layer*,std::allocator<Layer*>> *)this,(Layer **)&local_70);
        this_00 = &local_68;
        goto LAB_0011994d;
      }
    }
  }
  pFVar3 = (Filter *)operator_new(0xa0);
  iVar1 = this->inputSize;
  std::__cxx11::string::string((string *)&local_48,(string *)type);
  Filter::Filter(pFVar3,iVar1,size,&this->learning_rate,&local_48);
  local_70 = pFVar3;
  std::vector<Layer*,std::allocator<Layer*>>::emplace_back<Layer*>
            ((vector<Layer*,std::allocator<Layer*>> *)this,(Layer **)&local_70);
  this_00 = &local_48;
LAB_0011994d:
  std::__cxx11::string::~string((string *)this_00);
  return;
}

Assistant:

void ANN::addLayer(int size, string type) {
    outputSize = size;
    if(type.rfind("lowpass", 0) == 0 || type.rfind("highpass", 0) == 0 || type.rfind("passband", 0) == 0) {
        layers.push_back(new Filter(inputSize, size, &learning_rate, type));
    }
    else {
        layers.push_back(new Dense(inputSize, size, &learning_rate, type));
    }
}